

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall QtPrivate::QColorShower::retranslateStrings(QColorShower *this)

{
  long in_RDI;
  long in_FS_OFFSET;
  int n;
  char *c;
  char *in_stack_fffffffffffffea8;
  char *s;
  QString *in_stack_fffffffffffffeb8;
  QString *text;
  QLabel *in_stack_fffffffffffffec0;
  QLabel *this_00;
  QLabel local_50;
  char local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  c = local_20;
  n = (int)((ulong)*(undefined8 *)(in_RDI + 0x48) >> 0x20);
  QColorDialog::tr(in_stack_fffffffffffffea8,c,n);
  QLabel::setText(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  QString::~QString((QString *)0x73665f);
  s = *(char **)(in_RDI + 0x50);
  QColorDialog::tr(s,c,n);
  QLabel::setText(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  QString::~QString((QString *)0x7366ab);
  text = *(QString **)(in_RDI + 0x58);
  this_00 = &local_50;
  QColorDialog::tr(s,c,n);
  QLabel::setText(this_00,text);
  QString::~QString((QString *)0x7366f7);
  QColorDialog::tr(s,c,n);
  QLabel::setText(this_00,text);
  QString::~QString((QString *)0x736743);
  QColorDialog::tr(s,c,n);
  QLabel::setText(this_00,text);
  QString::~QString((QString *)0x73678f);
  QColorDialog::tr(s,c,n);
  QLabel::setText(this_00,text);
  QString::~QString((QString *)0x7367db);
  QColorDialog::tr(s,c,n);
  QLabel::setText(this_00,text);
  QString::~QString((QString *)0x73682a);
  QColorDialog::tr(s,c,n);
  QLabel::setText(this_00,text);
  QString::~QString((QString *)0x736885);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorShower::retranslateStrings()
{
    lblHue->setText(QColorDialog::tr("Hu&e:"));
    lblSat->setText(QColorDialog::tr("&Sat:"));
    lblVal->setText(QColorDialog::tr("&Val:"));
    lblRed->setText(QColorDialog::tr("&Red:"));
    lblGreen->setText(QColorDialog::tr("&Green:"));
    lblBlue->setText(QColorDialog::tr("Bl&ue:"));
    alphaLab->setText(QColorDialog::tr("A&lpha channel:"));
    lblHtml->setText(QColorDialog::tr("&HTML:"));
}